

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::gencovoutput(gulcalc *this,gulcoverageSampleslevel *gg)

{
  float fVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  value_type_conflict local_1c;
  gulcoverageSampleslevel *local_18;
  gulcoverageSampleslevel *gg_local;
  gulcalc *this_local;
  
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    local_18 = gg;
    gg_local = (gulcoverageSampleslevel *)this;
    pvVar2 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](&this->cov_,(long)gg->coverage_id);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(pvVar2);
    if (sVar3 == 0) {
      pvVar2 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&this->cov_,(long)local_18->coverage_id);
      local_1c = 0.0;
      std::vector<float,_std::allocator<float>_>::resize
                (pvVar2,(long)(this->samplesize_ + 3),&local_1c);
    }
    fVar1 = local_18->loss;
    pvVar2 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](&this->cov_,(long)local_18->coverage_id);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (pvVar2,(long)(local_18->sidx + 2));
    *pvVar4 = fVar1 + *pvVar4;
  }
  return;
}

Assistant:

void gulcalc::gencovoutput(gulcoverageSampleslevel &gg)
{
	if (coverageWriter_ == 0)  return;
	if (cov_[gg.coverage_id].size() == 0) {
		cov_[gg.coverage_id].resize(samplesize_ + 3, 0);
	}
	cov_[gg.coverage_id][gg.sidx + 2] += gg.loss;
}